

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O2

void __thiscall miniminer_tests::miniminer_negative::test_method(miniminer_negative *this)

{
  long lVar1;
  CTxMemPool *this_00;
  element_type *peVar2;
  uchar *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  uint256 *puVar7;
  base_blob<256U> *pbVar8;
  uint32_t num_bytes;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar9;
  CTxMemPoolEntry **ppCVar10;
  CAmount CVar11;
  size_type sVar12;
  lazy_ostream *assertion_descr;
  iterator pvVar13;
  iterator pvVar14;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  initializer_list<COutPoint> __l_01;
  const_string file_03;
  optional<CFeeRate> target_feerate;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  check_type cVar16;
  _Base_ptr p_Var15;
  char *local_5a0;
  char *local_598;
  char *local_590;
  _Base_ptr local_588;
  _Rb_tree_node_base local_580;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  _Rb_tree_node_base local_538;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  CFeeRate feerate_zero;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  CTransactionRef tx_mod_negative;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  CAmount negative_fee_delta;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> template_txids;
  MiniMiner mini_miner_no_target;
  MiniMiner mini_miner_target0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar9 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                      ,0x4d,"test_method","m_node.mempool");
  this_00 = (puVar9->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
             ,0x4e,false);
  pvVar13 = (iterator)0x4e;
  pvVar14 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this_00->cs,"pool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
             ,0x4e,false);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  negative_fee_delta = -50000;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x55;
  file.m_begin = (iterator)&local_400;
  msg.m_end = pvVar14;
  msg.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_410,msg);
  mini_miner_no_target.m_ready_to_calculate = true;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl._0_8_ = 0;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mini_miner_target0.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&template_txids;
  template_txids._M_t._M_impl._0_8_ = anon_var_dwarf_90ddcd;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"negative_modified_fees < 0" + 0x1a;
  mini_miner_target0.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_target0.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  mini_miner_target0._0_8_ = &PTR__lazy_ostream_011481f0;
  mini_miner_target0.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_418 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&mini_miner_no_target,(lazy_ostream *)&mini_miner_target0,1,0,WARN,
             _cVar16,(size_t)&local_420,0x55);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  peVar2 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[4].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  mini_miner_target0._0_8_ = *(undefined8 *)&(peVar2->hash).m_wrapped;
  puVar3 = (uchar *)((long)&peVar2->hash + 8);
  mini_miner_target0.m_to_be_replaced._M_t._M_impl._0_1_ = puVar3[0];
  mini_miner_target0.m_to_be_replaced._M_t._M_impl._1_1_ = puVar3[1];
  mini_miner_target0.m_to_be_replaced._M_t._M_impl._2_1_ = puVar3[2];
  mini_miner_target0.m_to_be_replaced._M_t._M_impl._3_1_ = puVar3[3];
  mini_miner_target0.m_to_be_replaced._M_t._M_impl._4_1_ = puVar3[4];
  mini_miner_target0.m_to_be_replaced._M_t._M_impl._5_1_ = puVar3[5];
  mini_miner_target0.m_to_be_replaced._M_t._M_impl._6_1_ = puVar3[6];
  mini_miner_target0.m_to_be_replaced._M_t._M_impl._7_1_ = puVar3[7];
  mini_miner_target0.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  mini_miner_target0.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar2->hash + 0x18);
  mini_miner_target0.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0
  ;
  __l._M_len = 1;
  __l._M_array = (iterator)&mini_miner_target0;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&mini_miner_no_target,__l,
             (allocator_type *)&template_txids);
  make_tx((miniminer_tests *)&tx_mod_negative,
          (vector<COutPoint,_std::allocator<COutPoint>_> *)&mini_miner_no_target,1);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&mini_miner_no_target);
  entry.nFee = 1000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&mini_miner_target0,&entry,&tx_mod_negative);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&mini_miner_target0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&mini_miner_target0);
  CTxMemPool::PrioritiseTransaction
            (this_00,&((tx_mod_negative.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      hash).m_wrapped,&negative_fee_delta);
  puVar7 = &((tx_mod_negative.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->hash).m_wrapped;
  uVar4._0_1_ = (bool)(puVar7->super_base_blob<256U>).m_data._M_elems[0];
  uVar4._1_1_ = (puVar7->super_base_blob<256U>).m_data._M_elems[1];
  uVar4._2_1_ = (puVar7->super_base_blob<256U>).m_data._M_elems[2];
  uVar4._3_1_ = (puVar7->super_base_blob<256U>).m_data._M_elems[3];
  uVar4._4_1_ = (puVar7->super_base_blob<256U>).m_data._M_elems[4];
  uVar4._5_1_ = (puVar7->super_base_blob<256U>).m_data._M_elems[5];
  uVar4._6_1_ = (puVar7->super_base_blob<256U>).m_data._M_elems[6];
  uVar4._7_1_ = (puVar7->super_base_blob<256U>).m_data._M_elems[7];
  pbVar8 = &((tx_mod_negative.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->hash).m_wrapped.super_base_blob<256U>;
  uVar5._0_1_ = (pbVar8->m_data)._M_elems[8];
  uVar5._1_1_ = (pbVar8->m_data)._M_elems[9];
  uVar5._2_1_ = (pbVar8->m_data)._M_elems[10];
  uVar5._3_1_ = (pbVar8->m_data)._M_elems[0xb];
  uVar5._4_1_ = (pbVar8->m_data)._M_elems[0xc];
  uVar5._5_1_ = (pbVar8->m_data)._M_elems[0xd];
  uVar5._6_1_ = (pbVar8->m_data)._M_elems[0xe];
  uVar5._7_1_ = (pbVar8->m_data)._M_elems[0xf];
  p_Var15 = *(_Base_ptr *)
             (((tx_mod_negative.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  p_Var6 = *(_Base_ptr *)
            (((tx_mod_negative.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
       0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&mini_miner_no_target;
  mini_miner_no_target._0_8_ = uVar4;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl._0_8_ = uVar5;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = p_Var15
  ;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       p_Var6;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&template_txids,__l_00,
             (allocator_type *)&local_538);
  ::node::MiniMiner::MiniMiner
            (&mini_miner_target0,this_00,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&template_txids);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&template_txids);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5d;
  file_00.m_begin = (iterator)&local_440;
  msg_00.m_end = pvVar14;
  msg_00.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_450,
             msg_00);
  template_txids._M_t._M_impl._0_1_ = mini_miner_target0.m_ready_to_calculate;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_538._0_8_ = "mini_miner_target0.IsReadyToCalculate()";
  local_538._M_parent = (_Base_ptr)0xbb59c6;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_no_target.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  mini_miner_no_target._0_8_ = &PTR__lazy_ostream_011481f0;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_458 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       &local_538;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&template_txids,(lazy_ostream *)&mini_miner_no_target,1,0,WARN,
             _cVar16,(size_t)&local_460,0x5d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  feerate_zero.nSatoshisPerK = 0;
  ::node::MiniMiner::BuildMockTemplate(&mini_miner_target0,(optional<CFeeRate>)(ZEXT816(1) << 0x40))
  ;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x61;
  file_01.m_begin = (iterator)&local_478;
  msg_01.m_end = pvVar14;
  msg_01.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_488,
             msg_01);
  local_580._0_8_ =
       CTxMemPool::GetEntry
                 (this_00,&(tx_mod_negative.
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash);
  ppCVar10 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                       ((CTxMemPoolEntry **)&local_580,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                        ,0x61,"test_method","pool.GetEntry(tx_mod_negative->GetHash())");
  num_bytes = CTxMemPoolEntry::GetTxSize(*ppCVar10);
  CVar11 = CFeeRate::GetFee(&feerate_zero,num_bytes);
  template_txids._M_t._M_impl._0_1_ = -49000 < CVar11;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_538._0_8_ =
       "negative_modified_fees < feerate_zero.GetFee(inline_assertion_check<true>(pool.GetEntry(tx_mod_negative->GetHash()), \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp\", 97, __func__, \"pool.GetEntry(tx_mod_negative->GetHash())\")->GetTxSize())"
  ;
  local_538._M_parent = (_Base_ptr)0xbb5b13;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl._0_8_ =
       mini_miner_no_target.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
  mini_miner_no_target._0_8_ = &PTR__lazy_ostream_011481f0;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_490 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       &local_538;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&template_txids,(lazy_ostream *)&mini_miner_no_target,1,0,WARN,
             _cVar16,(size_t)&local_498,0x61);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x62;
  file_02.m_begin = (iterator)&local_4a8;
  msg_02.m_end = pvVar14;
  msg_02.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4b8,
             msg_02);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
              *)&mini_miner_no_target,&mini_miner_target0.m_in_block._M_t);
  local_538._M_parent = (_Base_ptr)0x0;
  local_538._M_left = (_Base_ptr)0x0;
  local_580._0_8_ = "mini_miner_target0.GetMockTemplateTxids().empty()";
  local_580._M_parent = (_Base_ptr)0xbb5b45;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       template_txids._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  template_txids._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_4c0 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &local_580;
  local_538._M_color._0_1_ =
       mini_miner_no_target.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       == (_Base_ptr)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_538,(lazy_ostream *)&template_txids,1,0,WARN,_cVar16,
             (size_t)&local_4c8,0x62);
  boost::detail::shared_count::~shared_count((shared_count *)&local_538._M_left);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               *)&mini_miner_no_target);
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&template_txids;
  template_txids._M_t._M_impl._0_8_ = uVar4;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uVar5;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var15;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var6;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&local_538,__l_01,
             (allocator_type *)&local_580);
  ::node::MiniMiner::MiniMiner
            (&mini_miner_no_target,this_00,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)&local_538);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            ((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)&local_538);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x66;
  file_03.m_begin = (iterator)&local_4d8;
  msg_03.m_end = pvVar14;
  msg_03.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4e8,
             msg_03);
  local_538._M_color._0_1_ = mini_miner_no_target.m_ready_to_calculate;
  local_538._M_parent = (_Base_ptr)0x0;
  local_538._M_left = (_Base_ptr)0x0;
  local_580._0_8_ = "mini_miner_no_target.IsReadyToCalculate()";
  local_580._M_parent = (_Base_ptr)0xbb5b6f;
  assertion_descr = (lazy_ostream *)&template_txids;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       template_txids._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  template_txids._M_t._M_impl._0_8_ = &PTR__lazy_ostream_011481f0;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_4f0 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  template_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &local_580;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_538,assertion_descr,1,0,WARN,_cVar16,(size_t)&local_4f8,0x66
            );
  boost::detail::shared_count::~shared_count((shared_count *)&local_538._M_left);
  target_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._8_8_ = 0;
  target_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = (_Storage<CFeeRate,_true>)assertion_descr;
  ::node::MiniMiner::BuildMockTemplate(&mini_miner_no_target,target_feerate);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::_Rb_tree(&template_txids._M_t,&mini_miner_no_target.m_in_block._M_t);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x69;
  file_04.m_begin = (iterator)&local_508;
  msg_04.m_end = pvVar14;
  msg_04.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_518,
             msg_04);
  local_538._M_parent = (_Base_ptr)((ulong)local_538._M_parent & 0xffffffffffffff00);
  local_538._0_8_ = &PTR__lazy_ostream_011480b0;
  local_538._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_538._M_right = (_Base_ptr)0xc7f1cc;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_540 = "";
  ppCVar10 = (CTxMemPoolEntry **)&local_580;
  local_580._0_8_ = template_txids._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_590 = (char *)CONCAT44(local_590._4_4_,_S_black);
  pvVar13 = (iterator)0x2;
  p_Var15 = (_Base_ptr)&local_590;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_538,&local_548,0x69,1,2,ppCVar10,"template_txids.size()",(_Base_ptr)&local_590,
             "1");
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_550 = "";
  local_580._M_right = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x6a;
  file_05.m_begin = (iterator)&local_558;
  msg_05.m_end = (iterator)ppCVar10;
  msg_05.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
             (size_t)&local_580._M_right,msg_05);
  sVar12 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count
                     (&template_txids,
                      &((tx_mod_negative.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->hash).m_wrapped);
  local_580._M_color._0_1_ = sVar12 != 0;
  local_580._M_parent = (_Base_ptr)0x0;
  local_580._M_left = (_Base_ptr)0x0;
  local_590 = "template_txids.count(tx_mod_negative->GetHash().ToUint256()) > 0";
  local_588 = (_Base_ptr)0xbb5bc6;
  local_538._M_parent = (_Base_ptr)((ulong)local_538._M_parent & 0xffffffffffffff00);
  local_538._0_8_ = &PTR__lazy_ostream_011481f0;
  local_538._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_598 = "";
  local_538._M_right = (_Base_ptr)&local_590;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_580,(lazy_ostream *)&local_538,1,0,WARN,(check_type)p_Var15,
             (size_t)&local_5a0,0x6a);
  boost::detail::shared_count::~shared_count((shared_count *)&local_580._M_left);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&template_txids._M_t);
  ::node::MiniMiner::~MiniMiner(&mini_miner_no_target);
  ::node::MiniMiner::~MiniMiner(&mini_miner_target0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx_mod_negative.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(miniminer_negative, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    // Create a transaction that will be prioritised to have a negative modified fee.
    const CAmount positive_base_fee{1000};
    const CAmount negative_fee_delta{-50000};
    const CAmount negative_modified_fees{positive_base_fee + negative_fee_delta};
    BOOST_CHECK(negative_modified_fees < 0);
    const auto tx_mod_negative = make_tx({COutPoint{m_coinbase_txns[4]->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(positive_base_fee).FromTx(tx_mod_negative));
    pool.PrioritiseTransaction(tx_mod_negative->GetHash(), negative_fee_delta);
    const COutPoint only_outpoint{tx_mod_negative->GetHash(), 0};

    // When target feerate is 0, transactions with negative fees are not selected.
    node::MiniMiner mini_miner_target0(pool, {only_outpoint});
    BOOST_CHECK(mini_miner_target0.IsReadyToCalculate());
    const CFeeRate feerate_zero(0);
    mini_miner_target0.BuildMockTemplate(feerate_zero);
    // Check the quit condition:
    BOOST_CHECK(negative_modified_fees < feerate_zero.GetFee(Assert(pool.GetEntry(tx_mod_negative->GetHash()))->GetTxSize()));
    BOOST_CHECK(mini_miner_target0.GetMockTemplateTxids().empty());

    // With no target feerate, the template includes all transactions, even negative feerate ones.
    node::MiniMiner mini_miner_no_target(pool, {only_outpoint});
    BOOST_CHECK(mini_miner_no_target.IsReadyToCalculate());
    mini_miner_no_target.BuildMockTemplate(std::nullopt);
    const auto template_txids{mini_miner_no_target.GetMockTemplateTxids()};
    BOOST_CHECK_EQUAL(template_txids.size(), 1);
    BOOST_CHECK(template_txids.count(tx_mod_negative->GetHash().ToUint256()) > 0);
}